

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3010f3::ArgParser::argVersion(ArgParser *this)

{
  Pipeline *pPVar1;
  Pipeline *this_00;
  string *str;
  string whoami;
  bool local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  QPDFLogger local_38;
  string local_28;
  
  QPDFArgParser::getProgname_abi_cxx11_(&local_28,&this->ap);
  QPDFLogger::defaultLogger();
  QPDFLogger::getInfo(&local_38,local_48);
  pPVar1 = Pipeline::operator<<
                     ((Pipeline *)
                      local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,&local_28);
  this_00 = Pipeline::operator<<(pPVar1," version ");
  str = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)pPVar1);
  pPVar1 = Pipeline::operator<<(this_00,str);
  pPVar1 = Pipeline::operator<<(pPVar1,"\n");
  pPVar1 = Pipeline::operator<<(pPVar1,"Run ");
  pPVar1 = Pipeline::operator<<(pPVar1,&local_28);
  Pipeline::operator<<(pPVar1," --copyright to see copyright and license information.\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void
ArgParser::argVersion()
{
    auto whoami = this->ap.getProgname();
    *QPDFLogger::defaultLogger()->getInfo()
        << whoami << " version " << QPDF::QPDFVersion() << "\n"
        << "Run " << whoami << " --copyright to see copyright and license information.\n";
}